

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::SourceCodeInfo_Location::Clear(SourceCodeInfo_Location *this)

{
  uint uVar1;
  Rep *pRVar2;
  undefined8 *puVar3;
  string *psVar4;
  long lVar5;
  long lVar6;
  
  (this->path_).current_size_ = 0;
  (this->span_).current_size_ = 0;
  lVar5 = (long)(this->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < lVar5) {
    pRVar2 = (this->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_;
    lVar6 = 0;
    do {
      puVar3 = (undefined8 *)pRVar2->elements[lVar6];
      lVar6 = lVar6 + 1;
      puVar3[1] = 0;
      *(undefined1 *)*puVar3 = 0;
    } while (lVar5 != lVar6);
    (this->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_ = 0;
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      psVar4 = (this->leading_comments_).ptr_;
      psVar4->_M_string_length = 0;
      *(psVar4->_M_dataplus)._M_p = '\0';
    }
    if ((uVar1 & 2) != 0) {
      psVar4 = (this->trailing_comments_).ptr_;
      psVar4->_M_string_length = 0;
      *(psVar4->_M_dataplus)._M_p = '\0';
    }
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return;
  }
  internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  return;
}

Assistant:

void SourceCodeInfo_Location::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.SourceCodeInfo.Location)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  path_.Clear();
  span_.Clear();
  leading_detached_comments_.Clear();
  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      leading_comments_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000002u) {
      trailing_comments_.ClearNonDefaultToEmpty();
    }
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}